

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.h
# Opt level: O0

void get_eobx_eoby_scan_default(int *eobx,int *eoby,TX_SIZE tx_size,int eob)

{
  short sVar1;
  int eobxy;
  int eob_row;
  int tx_w_log2;
  int eob_local;
  TX_SIZE tx_size_local;
  int *eoby_local;
  int *eobx_local;
  
  if (eob == 1) {
    *eobx = 0;
    *eoby = 0;
  }
  else {
    sVar1 = av1_eob_to_eobxy_default[tx_size]
            [eob + -1 >> ((byte)tx_size_wide_log2_eob[tx_size] & 0x1f)];
    *eobx = (int)sVar1 & 0xff;
    *eoby = (int)sVar1 >> 8;
  }
  return;
}

Assistant:

static inline void get_eobx_eoby_scan_default(int *eobx, int *eoby,
                                              TX_SIZE tx_size, int eob) {
  if (eob == 1) {
    *eobx = 0;
    *eoby = 0;
    return;
  }

  const int tx_w_log2 = tx_size_wide_log2_eob[tx_size];
  const int eob_row = (eob - 1) >> tx_w_log2;
  const int eobxy = av1_eob_to_eobxy_default[tx_size][eob_row];
  *eobx = eobxy & 0xFF;
  *eoby = eobxy >> 8;
}